

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int base64_decode_quartet_using_maps(base64_maps_t *maps,char *dest,char *src)

{
  int8_t iVar1;
  int8_t iVar2;
  int8_t iVar3;
  byte bVar4;
  int iVar5;
  
  iVar1 = sixbit_from_b64(maps,*src);
  iVar2 = sixbit_from_b64(maps,src[1]);
  iVar3 = sixbit_from_b64(maps,src[2]);
  bVar4 = sixbit_from_b64(maps,src[3]);
  if ((bVar4 == 0xff || iVar3 == -1) || (iVar2 == -1 || iVar1 == -1)) {
    iVar5 = -1;
  }
  else {
    *dest = iVar2 >> 4 | iVar1 << 2;
    dest[1] = iVar3 >> 2 | iVar2 << 4;
    dest[2] = bVar4 | iVar3 << 6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int base64_decode_quartet_using_maps(const base64_maps_t *maps, char dest[3],
				     const char src[4])
{
	signed char a;
	signed char b;
	signed char c;
	signed char d;

	a = sixbit_from_b64(maps, src[0]);
	b = sixbit_from_b64(maps, src[1]);
	c = sixbit_from_b64(maps, src[2]);
	d = sixbit_from_b64(maps, src[3]);

	if ((a == -1) || (b == -1) || (c == -1) || (d == -1)) {
		return -1;
	}

	dest[0] = (a << 2) | (b >> 4);
	dest[1] = ((b & 0xf) << 4) | (c >> 2);
	dest[2] = ((c & 0x3) << 6) | d;

	return 0;
}